

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::NLFeeder_Easy::
FeedInitialDualGuesses<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,mp::NLFeeder_Easy>>::SingleSparseVecWrtFactory<int,double>>
          (NLFeeder_Easy *this,SingleSparseVecWrtFactory<int,_double> *igw)

{
  NLModel *this_00;
  NLFeeder_Easy *in_RDI;
  int i;
  SparseVectorWriter<int,_double> ig;
  NLW2_SparseVector_C ini;
  int in_stack_ffffffffffffffac;
  SparseVectorWriter<int,_double> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar1;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_> *in_stack_ffffffffffffffc8
  ;
  NLW2_SparseVector_C local_28;
  
  this_00 = NLME(in_RDI);
  NLModel::DualWarmstart(&local_28,this_00);
  if (local_28.num_ != 0) {
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::
    SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
              ((SingleSparseVecWrtFactory<int,_double> *)in_stack_ffffffffffffffc8,
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    for (iVar1 = 0; iVar1 < local_28.num_; iVar1 = iVar1 + 1) {
      NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::
      SparseVectorWriter<int,_double>::Write
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,6.46294682309622e-318);
    }
    NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLFeeder_Easy>_>::
    SparseVectorWriter<int,_double>::~SparseVectorWriter
              ((SparseVectorWriter<int,_double> *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void FeedInitialDualGuesses(IDGWriter& igw) {
    auto ini = NLME().DualWarmstart();
    if (ini.num_) {
      auto ig = igw.MakeVectorWriter(ini.num_);
      for (int i=0; i<ini.num_; ++i)
        ig.Write(ini.index_[i], ini.value_[i]);
    }
  }